

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MolecularRestraint.cpp
# Opt level: O0

void __thiscall
OpenMD::MolecularRestraint::calcForce
          (MolecularRestraint *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *struc,
          Vector3d *molCom)

{
  bool bVar1;
  mapped_type *pmVar2;
  double *pdVar3;
  ulong uVar4;
  size_type sVar5;
  SVD<double> *this_00;
  SVD<double> *pSVar6;
  Vector<double,_3U> *in_RDX;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *in_RSI;
  long in_RDI;
  double dVar7;
  double dVar8;
  Vector<double,_3U> *v1;
  pair<double,_double> pVar9;
  uint i;
  Vector3d fLab;
  Vector3d fBody;
  Vector3d txr;
  Vector3d rBody;
  Vector3d rLab;
  RealType t2;
  RealType p_2;
  RealType dSwingY;
  RealType dSwingX;
  RealType dTwist;
  RealType dVdswingY;
  RealType dVdswingX;
  RealType dVdtwist;
  RealType swingY;
  RealType swingX;
  RealType twistAngle;
  Quat4d quat;
  RotMat3x3d A;
  RotMat3x3d Atrans;
  bool is_reflection;
  Mat3x3d w_tr;
  Vector3d s;
  Mat3x3d v;
  SVD<double> svd;
  DynamicRectMatrix<double> wtmp;
  DynamicVector<double,_std::allocator<double>_> stmp;
  DynamicRectMatrix<double> vtmp;
  DynamicRectMatrix<double> Rtmp;
  DynamicRectMatrix<double> *in_stack_00000518;
  SVD<double> *in_stack_00000520;
  uint n;
  Mat3x3d R;
  Vector3d tBody;
  Vector3d frc;
  RealType p_1;
  RealType r_1;
  RealType p;
  RealType r;
  Vector3d del;
  iterator it;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffff8e8;
  SVD<double> *in_stack_fffffffffffff8f0;
  DynamicRectMatrix<double> *in_stack_fffffffffffff8f8;
  SVD<double> *in_stack_fffffffffffff900;
  size_type in_stack_fffffffffffff908;
  DynamicRectMatrix<double> *in_stack_fffffffffffff910;
  mapped_type *in_stack_fffffffffffff918;
  SquareMatrix3<double> *in_stack_fffffffffffff920;
  SquareMatrix3<double> *in_stack_fffffffffffff928;
  mapped_type *in_stack_fffffffffffff930;
  DynamicRectMatrix<double> *in_stack_fffffffffffff938;
  SVD<double> *in_stack_fffffffffffff940;
  double *in_stack_fffffffffffff948;
  Vector3<double> *in_stack_fffffffffffff950;
  Vector3<double> *in_stack_fffffffffffff958;
  Quaternion<double> *in_stack_fffffffffffff960;
  SquareMatrix3<double> *in_stack_fffffffffffff9a8;
  uint local_5cc;
  pair<double,_double> local_540 [2];
  undefined4 local_514;
  pair<double,_double> local_510 [2];
  undefined4 local_4e4;
  pair<double,_double> local_4e0 [2];
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_4a0;
  double local_498;
  double local_490;
  double local_488;
  double local_480;
  double local_478;
  double local_470;
  undefined1 local_369;
  SquareMatrix3<double> local_368;
  RectMatrix<double,_3U,_3U> local_308 [4];
  uint local_1d4;
  double local_188;
  Vector<double,_3U> local_180 [3];
  Vector3<double> *local_138;
  Vector3<double> *local_130;
  undefined4 local_124;
  pair<double,_double> local_120 [2];
  double local_f8;
  double local_f0;
  Vector3<double> *local_b8;
  Vector3<double> *local_b0;
  undefined4 local_a4;
  pair<double,_double> local_a0;
  double local_90;
  double local_88;
  double local_50;
  Vector<double,_3U> local_48;
  Vector3<double> *local_30;
  Vector3<double> *local_28;
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  local_20 [4];
  
  __gnu_cxx::
  __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
  ::__normal_iterator(local_20);
  *(undefined8 *)(in_RDI + 0x38) = 0;
  local_28 = (Vector3<double> *)
             std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::begin
                       ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_fffffffffffff8e8);
  local_20[0]._M_current = local_28;
  while( true ) {
    local_30 = (Vector3<double> *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::end
                         ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           *)in_stack_fffffffffffff8e8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_fffffffffffff8f0,
                       (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                        *)in_stack_fffffffffffff8e8);
    if (!bVar1) break;
    local_50 = 0.0;
    Vector<double,_3U>::Vector(&local_48,&local_50);
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator*(local_20);
    Vector3<double>::operator=
              ((Vector3<double> *)in_stack_fffffffffffff8f8,
               (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
    __gnu_cxx::
    __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
    ::operator++(local_20);
  }
  if ((*(uint *)(in_RDI + 100) & 1) != 0) {
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffff8f8,
                      (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff8f0,
               (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
    local_88 = Vector<double,_3U>::length((Vector<double,_3U> *)0x336c44);
    local_90 = *(double *)(in_RDI + 0x10) * 0.5 * local_88 * local_88;
    *(double *)(in_RDI + 0x38) = local_90 + *(double *)(in_RDI + 0x38);
    if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
      pVar9 = std::make_pair<double&,double&>
                        ((double *)in_stack_fffffffffffff8f0,(double *)in_stack_fffffffffffff8e8);
      local_a0.first = pVar9.first;
      local_a0.second = pVar9.second;
      local_a4 = 1;
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                             *)in_stack_fffffffffffff930,(key_type *)in_stack_fffffffffffff928);
      std::pair<double,_double>::operator=(pmVar2,&local_a0);
    }
    local_b0 = (Vector3<double> *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
               begin((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffff8e8);
    local_20[0]._M_current = local_b0;
    while( true ) {
      local_b8 = (Vector3<double> *)
                 std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                 end((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                     in_stack_fffffffffffff8e8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffff8f0,
                         (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffff8e8);
      if (!bVar1) break;
      OpenMD::operator*((double)in_stack_fffffffffffff8f8,
                        (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
      OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff8f8,
                        (double)in_stack_fffffffffffff8f0);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator*(local_20);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator++(local_20);
    }
  }
  if ((*(uint *)(in_RDI + 100) & 2) != 0) {
    pdVar3 = Vector<double,_3U>::operator()(in_RDX,2);
    local_f0 = *pdVar3 - *(double *)(in_RDI + 0x58);
    local_f8 = *(double *)(in_RDI + 0x18) * 0.5 * local_f0 * local_f0;
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff900,(double)in_stack_fffffffffffff8f8,
               (double)in_stack_fffffffffffff8f0,(double)in_stack_fffffffffffff8e8);
    *(double *)(in_RDI + 0x38) = local_f8 + *(double *)(in_RDI + 0x38);
    if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
      pVar9 = std::make_pair<double&,double&>
                        ((double *)in_stack_fffffffffffff8f0,(double *)in_stack_fffffffffffff8e8);
      local_120[0].first = pVar9.first;
      local_120[0].second = pVar9.second;
      local_124 = 2;
      pmVar2 = std::
               map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
               ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                             *)in_stack_fffffffffffff930,(key_type *)in_stack_fffffffffffff928);
      std::pair<double,_double>::operator=(pmVar2,local_120);
    }
    local_130 = (Vector3<double> *)
                std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                begin((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffff8e8);
    local_20[0]._M_current = local_130;
    while( true ) {
      local_138 = (Vector3<double> *)
                  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                  end((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                      in_stack_fffffffffffff8e8);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffff8f0,
                         (__normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
                          *)in_stack_fffffffffffff8e8);
      if (!bVar1) break;
      OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffff8f8,
                        (double)in_stack_fffffffffffff8f0);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator*(local_20);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      __gnu_cxx::
      __normal_iterator<OpenMD::Vector3<double>_*,_std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>_>
      ::operator++(local_20);
    }
  }
  if (3 < *(int *)(in_RDI + 100)) {
    local_188 = 0.0;
    Vector<double,_3U>::Vector(local_180,&local_188);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffff8f0,
               (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
    SquareMatrix3<double>::SquareMatrix3
              ((SquareMatrix3<double> *)in_stack_fffffffffffff8f0,(double)in_stack_fffffffffffff8e8)
    ;
    for (local_1d4 = 0; uVar4 = (ulong)local_1d4,
        sVar5 = std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
                size(in_RSI), uVar4 < sVar5; local_1d4 = local_1d4 + 1) {
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (in_RSI,(ulong)local_1d4);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      in_stack_fffffffffffff9a8 =
           (SquareMatrix3<double> *)
           std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
           operator[](in_RSI,(ulong)local_1d4);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0xb8),(ulong)local_1d4);
      outProduct<double>((Vector3<double> *)in_stack_fffffffffffff918,
                         (Vector3<double> *)in_stack_fffffffffffff910);
      RectMatrix<double,_3U,_3U>::operator+=
                ((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x3370f5);
    }
    DynamicRectMatrix<double>::DynamicRectMatrix
              (&in_stack_fffffffffffff900->U,(uint)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (uint)in_stack_fffffffffffff8f8,(double)in_stack_fffffffffffff8f0);
    DynamicRectMatrix<double>::DynamicRectMatrix
              (&in_stack_fffffffffffff900->U,(uint)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (uint)in_stack_fffffffffffff8f8);
    std::allocator<double>::allocator((allocator<double> *)0x33718e);
    DynamicVector<double,_std::allocator<double>_>::DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8f0,
               (size_type)in_stack_fffffffffffff8e8,(allocator_type *)0x3371a8);
    std::allocator<double>::~allocator((allocator<double> *)0x3371b7);
    DynamicRectMatrix<double>::DynamicRectMatrix
              (&in_stack_fffffffffffff900->U,(uint)((ulong)in_stack_fffffffffffff8f8 >> 0x20),
               (uint)in_stack_fffffffffffff8f8);
    DynamicRectMatrix<double>::setSubMatrix<OpenMD::SquareMatrix3<double>>
              (in_stack_fffffffffffff910,(uint)(in_stack_fffffffffffff908 >> 0x20),
               (uint)in_stack_fffffffffffff908,(SquareMatrix3<double> *)in_stack_fffffffffffff900);
    JAMA::SVD<double>::SVD(in_stack_00000520,in_stack_00000518);
    JAMA::SVD<double>::getU(in_stack_fffffffffffff940,in_stack_fffffffffffff938);
    JAMA::SVD<double>::getSingularValues
              (in_stack_fffffffffffff8f0,
               (DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8e8);
    JAMA::SVD<double>::getV(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x337251);
    Vector3<double>::Vector3((Vector3<double> *)0x337260);
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x33726f);
    DynamicRectMatrix<double>::getSubMatrix<OpenMD::SquareMatrix3<double>>
              (in_stack_fffffffffffff910,(uint)(in_stack_fffffffffffff908 >> 0x20),
               (uint)in_stack_fffffffffffff908,(SquareMatrix3<double> *)in_stack_fffffffffffff900);
    DynamicVector<double,std::allocator<double>>::getSubVector<OpenMD::Vector3<double>>
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_fffffffffffff910,
               in_stack_fffffffffffff908,(Vector3<double> *)in_stack_fffffffffffff900);
    DynamicRectMatrix<double>::getSubMatrix<OpenMD::SquareMatrix3<double>>
              (in_stack_fffffffffffff910,(uint)(in_stack_fffffffffffff908 >> 0x20),
               (uint)in_stack_fffffffffffff908,(SquareMatrix3<double> *)in_stack_fffffffffffff900);
    dVar7 = SquareMatrix3<double>::determinant((SquareMatrix3<double> *)local_308);
    dVar8 = SquareMatrix3<double>::determinant(&local_368);
    local_369 = dVar7 * dVar8 < 0.0;
    if ((bool)local_369) {
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_308,2,0);
      dVar7 = *pdVar3;
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_308,2,0);
      *pdVar3 = -dVar7;
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_308,2,1);
      in_stack_fffffffffffff960 = (Quaternion<double> *)((ulong)*pdVar3 ^ 0x8000000000000000);
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(local_308,2,1);
      *pdVar3 = (double)in_stack_fffffffffffff960;
      in_stack_fffffffffffff958 =
           (Vector3<double> *)RectMatrix<double,_3U,_3U>::operator()(local_308,2,2);
      in_stack_fffffffffffff948 =
           (double *)
           ((ulong)(in_stack_fffffffffffff958->super_Vector<double,_3U>).data_[0] ^
           0x8000000000000000);
      in_stack_fffffffffffff950 =
           (Vector3<double> *)RectMatrix<double,_3U,_3U>::operator()(local_308,2,2);
      (in_stack_fffffffffffff950->super_Vector<double,_3U>).data_[0] =
           (double)in_stack_fffffffffffff948;
    }
    SquareMatrix3<double>::transpose(in_stack_fffffffffffff928);
    OpenMD::operator*(in_stack_fffffffffffff928,in_stack_fffffffffffff920);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x33756e);
    SquareMatrix3<double>::transpose(in_stack_fffffffffffff928);
    SquareMatrix3<double>::toQuaternion(in_stack_fffffffffffff9a8);
    Quaternion<double>::toTwistSwing
              (in_stack_fffffffffffff960,(double *)in_stack_fffffffffffff958,
               (double *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
    if ((*(uint *)(in_RDI + 100) & 4) != 0) {
      local_4a0 = local_470 - *(double *)(in_RDI + 0x40);
      local_488 = *(double *)(in_RDI + 0x20) * local_4a0;
      local_4b8 = *(double *)(in_RDI + 0x20) * 0.5 * local_4a0 * local_4a0;
      *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) + local_4b8;
      OpenMD::operator*((double)in_stack_fffffffffffff8f8,
                        (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
        pVar9 = std::make_pair<double&,double&>
                          ((double *)in_stack_fffffffffffff8f0,(double *)in_stack_fffffffffffff8e8);
        local_4e0[0].first = pVar9.first;
        local_4e0[0].second = pVar9.second;
        local_4e4 = 4;
        in_stack_fffffffffffff930 =
             std::
             map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
             ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffff930,(key_type *)in_stack_fffffffffffff928);
        std::pair<double,_double>::operator=(in_stack_fffffffffffff930,local_4e0);
      }
    }
    if ((*(uint *)(in_RDI + 100) & 8) != 0) {
      local_4a8 = local_478 - *(double *)(in_RDI + 0x48);
      local_490 = *(double *)(in_RDI + 0x28) * local_4a8;
      local_4b8 = *(double *)(in_RDI + 0x28) * 0.5 * local_4a8 * local_4a8;
      *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) + local_4b8;
      OpenMD::operator*((double)in_stack_fffffffffffff8f8,
                        (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
        pVar9 = std::make_pair<double&,double&>
                          ((double *)in_stack_fffffffffffff8f0,(double *)in_stack_fffffffffffff8e8);
        in_stack_fffffffffffff928 = (SquareMatrix3<double> *)pVar9.first;
        local_510[0].second = pVar9.second;
        local_514 = 8;
        local_510[0].first = (double)in_stack_fffffffffffff928;
        in_stack_fffffffffffff918 =
             std::
             map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
             ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffff930,(key_type *)in_stack_fffffffffffff928);
        std::pair<double,_double>::operator=(in_stack_fffffffffffff918,local_510);
      }
    }
    if ((*(uint *)(in_RDI + 100) & 0x10) != 0) {
      local_4b0 = local_480 - *(double *)(in_RDI + 0x50);
      local_498 = *(double *)(in_RDI + 0x30) * local_4b0;
      local_4b8 = *(double *)(in_RDI + 0x28) * 0.5 * local_4b0 * local_4b0;
      *(double *)(in_RDI + 0x38) = *(double *)(in_RDI + 0x38) + local_4b8;
      OpenMD::operator*((double)in_stack_fffffffffffff8f8,
                        (Vector<double,_3U> *)in_stack_fffffffffffff8f0);
      Vector<double,_3U>::operator-=
                ((Vector<double,_3U> *)in_stack_fffffffffffff8f0,
                 (Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      if ((*(byte *)(in_RDI + 0x60) & 1) != 0) {
        pVar9 = std::make_pair<double&,double&>
                          ((double *)in_stack_fffffffffffff8f0,(double *)in_stack_fffffffffffff8e8);
        in_stack_fffffffffffff910 = (DynamicRectMatrix<double> *)pVar9.first;
        local_540[0].second = pVar9.second;
        local_540[0].first = (double)in_stack_fffffffffffff910;
        in_stack_fffffffffffff900 =
             (SVD<double> *)
             std::
             map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
             ::operator[]((map<int,_std::pair<double,_double>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<double,_double>_>_>_>
                           *)in_stack_fffffffffffff930,(key_type *)in_stack_fffffffffffff928);
        std::pair<double,_double>::operator=
                  ((pair<double,_double> *)in_stack_fffffffffffff900,local_540);
      }
    }
    v1 = (Vector<double,_3U> *)
         dot<double,3u>((Vector<double,_3U> *)in_stack_fffffffffffff900,
                        (Vector<double,_3U> *)in_stack_fffffffffffff8f8);
    Vector3<double>::Vector3((Vector3<double> *)0x337a84);
    Vector3<double>::Vector3((Vector3<double> *)0x337a93);
    Vector3<double>::Vector3((Vector3<double> *)0x337aa2);
    Vector3<double>::Vector3((Vector3<double> *)0x337ab1);
    Vector3<double>::Vector3((Vector3<double> *)0x337ac0);
    local_5cc = 0;
    while( true ) {
      this_00 = (SVD<double> *)(ulong)local_5cc;
      pSVar6 = (SVD<double> *)
               std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::size
                         (in_RSI);
      if (pSVar6 <= this_00) break;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                (in_RSI,(ulong)local_5cc);
      Vector3<double>::operator=
                ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffff8e8);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff918,
                        (Vector<double,_3U> *)in_stack_fffffffffffff910);
      Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)this_00);
      cross<double>(in_stack_fffffffffffff958,in_stack_fffffffffffff950);
      Vector3<double>::operator=
                ((Vector3<double> *)this_00,(Vector3<double> *)in_stack_fffffffffffff8e8);
      OpenMD::operator*(v1,(double)this_00);
      Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)this_00);
      OpenMD::operator*((RectMatrix<double,_3U,_3U> *)in_stack_fffffffffffff918,
                        (Vector<double,_3U> *)in_stack_fffffffffffff910);
      Vector3<double>::operator=((Vector3<double> *)v1,(Vector<double,_3U> *)this_00);
      Vector<double,_3U>::operator*=
                ((Vector<double,_3U> *)this_00,(double)in_stack_fffffffffffff8e8);
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 (in_RDI + 0xd0),(ulong)local_5cc);
      Vector<double,_3U>::operator+=
                ((Vector<double,_3U> *)this_00,(Vector<double,_3U> *)in_stack_fffffffffffff8e8);
      local_5cc = local_5cc + 1;
    }
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x337c68);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x337c75);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x337c82);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x337c8f);
    JAMA::SVD<double>::~SVD(this_00);
    DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x337ca9);
    DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x337cb6);
    DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x337cc3);
    DynamicRectMatrix<double>::~DynamicRectMatrix((DynamicRectMatrix<double> *)0x337cd0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x337cdd);
  }
  return;
}

Assistant:

void MolecularRestraint::calcForce(std::vector<Vector3d> struc,
                                     Vector3d molCom) {
    assert(struc.size() == ref_.size());

    std::vector<Vector3d>::iterator it;

    // clear out initial values:
    pot_ = 0.0;
    for (it = forces_.begin(); it != forces_.end(); ++it)
      (*it) = 0.0;

    if (restType_ & rtDisplacement) {
      Vector3d del = molCom - refCom_;

      RealType r = del.length();
      RealType p = 0.5 * kDisp_ * r * r;

      pot_ += p;

      if (printRest_) restInfo_[rtDisplacement] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += -kDisp_ * del * scaleFactor_;
    }

    if (restType_ & rtAbsoluteZ) {
      RealType r   = molCom(2) - posZ0_;
      RealType p   = 0.5 * kAbs_ * r * r;
      Vector3d frc = Vector3d(0.0, 0.0, -kAbs_ * r);

      pot_ += p;

      if (printRest_) restInfo_[rtAbsoluteZ] = std::make_pair(r, p);

      for (it = forces_.begin(); it != forces_.end(); ++it)
        (*it) += frc * scaleFactor_;
    }

    // rtDisplacement is 1, rtAbsolute is 2, so anything higher than 3
    // that requires orientations:
    if (restType_ > 3) {
      Vector3d tBody(0.0);

      Mat3x3d R(0.0);

      for (unsigned int n = 0; n < struc.size(); n++) {
        /*
         * First migrate the center of mass:
         */
        struc[n] -= molCom;

        /*
         * correlation matrix R:
         *   R(i,j) = sum(over n): y(n,i) * x(n,j)
         *   where x(n) and y(n) are two vector sets
         */

        R += outProduct(struc[n], ref_[n]);
      }

      // SVD class uses dynamic matrices, so we must wrap the correlation
      // matrix before calling SVD and then unwrap the results into Mat3x3d
      // and Vector3d before we use them.

      DynamicRectMatrix<RealType> Rtmp(3, 3, 0.0);
      DynamicRectMatrix<RealType> vtmp(3, 3);
      DynamicVector<RealType> stmp(3);
      DynamicRectMatrix<RealType> wtmp(3, 3);

      Rtmp.setSubMatrix(0, 0, R);

      // Heavy lifting goes here:

      JAMA::SVD<RealType> svd(Rtmp);

      svd.getU(vtmp);
      svd.getSingularValues(stmp);
      svd.getV(wtmp);

      Mat3x3d v;
      Vector3d s;
      Mat3x3d w_tr;

      vtmp.getSubMatrix(0, 0, v);
      stmp.getSubVector(0, s);
      wtmp.getSubMatrix(0, 0, w_tr);

      bool is_reflection = (v.determinant() * w_tr.determinant()) < 0.0;

      if (is_reflection) {
        v(2, 0) = -v(2, 0);
        v(2, 1) = -v(2, 1);
        v(2, 2) = -v(2, 2);
      }

      RotMat3x3d Atrans = v * w_tr.transpose();
      RotMat3x3d A      = Atrans.transpose();

      Quat4d quat = A.toQuaternion();

      RealType twistAngle;
      RealType swingX, swingY;

      quat.toTwistSwing(twistAngle, swingX, swingY);

      RealType dVdtwist, dVdswingX, dVdswingY;
      RealType dTwist, dSwingX, dSwingY;
      RealType p;

      if (restType_ & rtTwist) {
        dTwist = twistAngle - twist0_;
        /// dVdtwist = kTwist_ * sin(dTwist) ;
        /// p = kTwist_ * (1.0 - cos(dTwist) ) ;
        dVdtwist = kTwist_ * dTwist;
        p        = 0.5 * kTwist_ * dTwist * dTwist;
        pot_ += p;
        tBody -= dVdtwist * V3Z;
        if (printRest_) restInfo_[rtTwist] = std::make_pair(twistAngle, p);
      }

      if (restType_ & rtSwingX) {
        dSwingX = swingX - swingX0_;
        /// dVdswingX = kSwingX_ * 2.0 * sin(2.0 * dSwingX);
        /// p = kSwingX_ * (1.0 - cos(2.0 * dSwingX));
        dVdswingX = kSwingX_ * dSwingX;
        p         = 0.5 * kSwingX_ * dSwingX * dSwingX;
        pot_ += p;
        tBody -= dVdswingX * V3X;
        if (printRest_) restInfo_[rtSwingX] = std::make_pair(swingX, p);
      }
      if (restType_ & rtSwingY) {
        dSwingY = swingY - swingY0_;
        /// dVdswingY = kSwingY_ * 2.0 * sin(2.0 * dSwingY);
        /// p = kSwingY_ * (1.0 - cos(2.0 * dSwingY));
        dVdswingY = kSwingY_ * dSwingY;
        p         = 0.5 * kSwingX_ * dSwingY * dSwingY;
        pot_ += p;
        tBody -= dVdswingY * V3Y;
        if (printRest_) restInfo_[rtSwingY] = std::make_pair(swingY, p);
      }

      RealType t2 = dot(tBody, tBody);

      Vector3d rLab, rBody, txr, fBody, fLab;

      for (unsigned int i = 0; i < struc.size(); i++) {
        rLab  = struc[i];
        rBody = A * rLab;

        txr   = cross(tBody, rBody);
        fBody = txr * t2;
        fLab  = Atrans * fBody;
        fLab *= scaleFactor_;

        forces_[i] += fLab;
      }

      // test the force vectors and see if it is the right orientation
      //       std::cout << struc.size() << std::endl << std::endl;
      //       for (int i = 0; i != struc.size(); ++i){
      //         std::cout << "H\t" << struc[i].x() << "\t" << struc[i].y() <<
      //         "\t" << struc[i].z() << "\t"; std::cout << forces_[i].x() <<
      //         "\t"
      //         << forces_[i].y()
      //         << "\t" << forces_[i].z() << std::endl;
      //       }
    }
  }